

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::SwiftCompilerShellCommand::getVerboseDescription
          (SwiftCompilerShellCommand *this,SmallVectorImpl<char> *result)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  reference pSVar4;
  unsigned_long *puVar5;
  void *pvVar6;
  raw_ostream *prVar7;
  StringRef *arg;
  iterator __end2;
  iterator __begin2;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__range2;
  undefined1 local_f0 [7];
  bool first;
  raw_svector_ostream os;
  undefined1 local_b0 [8];
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> commandLine;
  SmallString<64U> outputFileMapPath;
  SmallVectorImpl<char> *result_local;
  SwiftCompilerShellCommand *this_local;
  void *P;
  size_t FindBegin;
  char local_19;
  reference local_18;
  long local_10;
  
  llvm::SmallString<64U>::SmallString
            ((SmallString<64U> *)
             &commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  getOutputFileMapPath
            (this,(SmallVectorImpl<char> *)
                  &commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::vector
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_b0);
  join_0x00000010_0x00000000_ =
       llvm::SmallString::operator_cast_to_StringRef
                 ((SmallString *)
                  &commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  constructCommandLineArgs
            (this,join_0x00000010_0x00000000_,
             (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_b0);
  llvm::raw_svector_ostream::raw_svector_ostream((raw_svector_ostream *)local_f0,result);
  bVar2 = true;
  __end2 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::begin
                     ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_b0);
  arg = (StringRef *)
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::end
                  ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_b0);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
                                     *)&arg), bVar3) {
    pSVar4 = __gnu_cxx::
             __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
             ::operator*(&__end2);
    if (!bVar2) {
      llvm::raw_ostream::operator<<((raw_ostream *)local_f0," ");
    }
    bVar2 = false;
    local_19 = ' ';
    FindBegin = 0;
    local_18 = pSVar4;
    puVar5 = std::min<unsigned_long>(&FindBegin,&pSVar4->Length);
    uVar1 = *puVar5;
    if ((uVar1 < pSVar4->Length) &&
       (pvVar6 = memchr(pSVar4->Data + uVar1,(int)local_19,pSVar4->Length - uVar1),
       pvVar6 != (void *)0x0)) {
      local_10 = (long)pvVar6 - (long)pSVar4->Data;
    }
    else {
      local_10 = -1;
    }
    if (local_10 == -1) {
      llvm::raw_ostream::operator<<((raw_ostream *)local_f0,*pSVar4);
    }
    else {
      prVar7 = llvm::raw_ostream::operator<<((raw_ostream *)local_f0,'\"');
      prVar7 = llvm::raw_ostream::operator<<(prVar7,*pSVar4);
      llvm::raw_ostream::operator<<(prVar7,'\"');
    }
    __gnu_cxx::
    __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
    ::operator++(&__end2);
  }
  llvm::raw_svector_ostream::~raw_svector_ostream((raw_svector_ostream *)local_f0);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_b0);
  llvm::SmallString<64U>::~SmallString
            ((SmallString<64U> *)
             &commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    SmallString<64> outputFileMapPath;
    getOutputFileMapPath(outputFileMapPath);
    
    std::vector<StringRef> commandLine;
    constructCommandLineArgs(outputFileMapPath, commandLine);
    
    llvm::raw_svector_ostream os(result);
    bool first = true;
    for (const auto& arg: commandLine) {
      if (!first) os << " ";
      first = false;
      // FIXME: This isn't correct, we need utilities for doing shell quoting.
      if (arg.find(' ') != StringRef::npos) {
        os << '"' << arg << '"';
      } else {
        os << arg;
      }
    }
  }